

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

void EvpathDestroyWriter(CP_Services Svcs,DP_WS_Stream WS_Stream_v)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = *(int *)((long)WS_Stream_v + 0x58);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      lVar2 = *(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar3 * 8);
      if (lVar2 != 0) {
        free((void *)**(undefined8 **)(lVar2 + 0x38));
        free(*(void **)(*(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar3 * 8) + 0x38));
        free((void *)**(undefined8 **)
                       (*(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar3 * 8) + 0x30));
        lVar2 = *(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar3 * 8);
        if (*(long *)(*(long *)(lVar2 + 0x30) + 8) != 0) {
          CMConnection_dereference();
          lVar2 = *(long *)((long)WS_Stream_v + 0x60);
          *(undefined8 *)(*(long *)(*(long *)(lVar2 + lVar3 * 8) + 0x30) + 8) = 0;
          lVar2 = *(long *)(lVar2 + lVar3 * 8);
        }
        if (*(void **)(lVar2 + 0x20) != (void *)0x0) {
          free(*(void **)(lVar2 + 0x20));
          lVar2 = *(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar3 * 8);
        }
        free(*(void **)(lVar2 + 0x30));
        free(*(void **)(*(long *)((long)WS_Stream_v + 0x60) + lVar3 * 8));
        iVar1 = *(int *)((long)WS_Stream_v + 0x58);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  free(*(void **)((long)WS_Stream_v + 0x60));
  free(WS_Stream_v);
  return;
}

Assistant:

static void EvpathDestroyWriter(CP_Services Svcs, DP_WS_Stream WS_Stream_v)
{
    Evpath_WS_Stream WS_Stream = (Evpath_WS_Stream)WS_Stream_v;
    for (int i = 0; i < WS_Stream->ReaderCount; i++)
    {
        if (WS_Stream->Readers[i])
        {
            free(WS_Stream->Readers[i]->WriterContactInfo->ContactString);
            free(WS_Stream->Readers[i]->WriterContactInfo);
            free(WS_Stream->Readers[i]->ReaderContactInfo->ContactString);
            if (WS_Stream->Readers[i]->ReaderContactInfo->Conn)
            {
                CMConnection_dereference(WS_Stream->Readers[i]->ReaderContactInfo->Conn);
                WS_Stream->Readers[i]->ReaderContactInfo->Conn = NULL;
            }
            if (WS_Stream->Readers[i]->ReaderRequestArray)
            {
                free(WS_Stream->Readers[i]->ReaderRequestArray);
            }
            free(WS_Stream->Readers[i]->ReaderContactInfo);
            free(WS_Stream->Readers[i]);
        }
    }
    free(WS_Stream->Readers);
    free(WS_Stream);
}